

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::internal::arg_formatter_base<fmt::v5::output_range<char_*,_char>_>::operator()
          (arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *this,
          basic_string_view<char> value)

{
  basic_string_view<char> s;
  iterator pcVar1;
  size_t in_RCX;
  void *in_RDX;
  size_t in_RSI;
  format_specs *in_RDI;
  error_handler *in_stack_ffffffffffffffa8;
  char spec;
  basic_writer<fmt::v5::output_range<char_*,_char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  error_handler local_19 [9];
  size_t local_10;
  
  if (*(long *)&(in_RDI->super_core_format_specs).flags == 0) {
    basic_writer<fmt::v5::output_range<char_*,_char>_>::write
              ((basic_writer<fmt::v5::output_range<char_*,_char>_> *)in_RDI,(int)in_RSI,in_RDX,
               in_RCX);
  }
  else {
    spec = *(char *)(*(long *)&(in_RDI->super_core_format_specs).flags + 0x11);
    local_10 = in_RSI;
    error_handler::error_handler(local_19);
    check_string_type_spec<char,fmt::v5::internal::error_handler>(spec,in_stack_ffffffffffffffa8);
    s.size_ = local_10;
    s.data_ = in_stack_ffffffffffffffc8;
    basic_writer<fmt::v5::output_range<char_*,_char>_>::write<char>
              (in_stack_ffffffffffffffc0,s,in_RDI);
  }
  pcVar1 = out((arg_formatter_base<fmt::v5::output_range<char_*,_char>_> *)0x1efabf);
  return pcVar1;
}

Assistant:

iterator operator()(basic_string_view<char_type> value) {
    if (specs_) {
      internal::check_string_type_spec(
            specs_->type, internal::error_handler());
      writer_.write(value, *specs_);
    } else {
      writer_.write(value);
    }
    return out();
  }